

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdiSubWindow::contextMenuEvent(QMdiSubWindow *this,QContextMenuEvent *contextMenuEvent)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x308) != 0) && (*(int *)(*(long *)(lVar1 + 0x308) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x310) != 0)) {
    cVar2 = '\x01';
    if (*(int *)(lVar1 + 0x2f0) != 1) {
      QMdiSubWindowPrivate::getRegion
                ((QMdiSubWindowPrivate *)&stack0xffffffffffffffc8,(Operation)lVar1);
      cVar2 = QRegion::contains((QPoint *)&stack0xffffffffffffffc8);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffffc8);
    }
    if (cVar2 != '\0') {
      QMenu::exec(*(QMenu **)(lVar1 + 0x310),(QPoint *)(contextMenuEvent + 0x30),(QAction *)0x0);
      goto LAB_0045a837;
    }
  }
  contextMenuEvent[0xc] = (QContextMenuEvent)0x0;
LAB_0045a837:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::contextMenuEvent(QContextMenuEvent *contextMenuEvent)
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu) {
        contextMenuEvent->ignore();
        return;
    }

    if (d->hoveredSubControl == QStyle::SC_TitleBarSysMenu
            || d->getRegion(QMdiSubWindowPrivate::Move).contains(contextMenuEvent->pos())) {
        d->systemMenu->exec(contextMenuEvent->globalPos());
    } else {
        contextMenuEvent->ignore();
    }
}